

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O3

int __thiscall
embree::ExtObjMaterial::select
          (ExtObjMaterial *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  float d;
  float Ns;
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  undefined4 uVar4;
  MetalMaterial *this_01;
  _func_int **pp_Var5;
  OBJMaterial *pOVar6;
  undefined4 in_register_00000034;
  uint *puVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  shared_ptr<embree::Texture> local_128;
  shared_ptr<embree::Texture> local_118;
  shared_ptr<embree::Texture> local_108;
  shared_ptr<embree::Texture> local_f8;
  shared_ptr<embree::Texture> local_e8;
  shared_ptr<embree::Texture> local_d8;
  shared_ptr<embree::Texture> local_c8;
  shared_ptr<embree::Texture> local_b8;
  shared_ptr<embree::Texture> local_a8;
  shared_ptr<embree::Texture> local_98;
  shared_ptr<embree::Texture> local_88;
  shared_ptr<embree::Texture> local_78;
  shared_ptr<embree::Texture> local_68;
  shared_ptr<embree::Texture> local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  puVar7 = (uint *)CONCAT44(in_register_00000034,__nfds);
  uVar1 = *puVar7;
  if (4 < (ulong)uVar1) {
    this_01 = (MetalMaterial *)alignedUSMMalloc(0x90,0x10,DEVICE_READ_ONLY);
    local_138._8_8_ = 0x3f0000003f000000;
    local_138._0_8_ = 0x3f0000003f000000;
    MatteMaterial::MatteMaterial((MatteMaterial *)this_01,(Vec3fa *)&local_138.field_1);
    *(MetalMaterial **)this = this_01;
    pp_Var5 = (this_01->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount;
    goto LAB_001410b0;
  }
  switch(uVar1) {
  case 0:
    pOVar6 = (OBJMaterial *)alignedUSMMalloc(0x180,0x10,DEVICE_READ_ONLY);
    d = (float)puVar7[2];
    local_b8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(puVar7 + 0x18);
    local_b8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar7 + 0x1a);
    if (local_b8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_b8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_b8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_b8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_b8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    local_c8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(puVar7 + 0x1c);
    local_c8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar7 + 0x1e);
    if (local_c8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_c8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_c8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_c8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_c8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(puVar7 + 0x20);
    local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar7 + 0x22);
    if (local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(puVar7 + 0x24);
    local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar7 + 0x26);
    if (local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(puVar7 + 0x28);
    local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar7 + 0x2a);
    if (local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    Ns = (float)puVar7[3];
    local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(puVar7 + 0x2c);
    local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar7 + 0x2e);
    if (local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(puVar7 + 0x30);
    local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar7 + 0x32);
    if (local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    OBJMaterial::OBJMaterial
              (pOVar6,d,&local_b8,(Vec3fa *)(puVar7 + 8),&local_c8,(Vec3fa *)(puVar7 + 0xc),
               &local_d8,(Vec3fa *)(puVar7 + 0x10),&local_e8,(Vec3fa *)(puVar7 + 0x14),&local_f8,Ns,
               &local_108,&local_118);
    *(OBJMaterial **)this = pOVar6;
    (*(pOVar6->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pOVar6);
    if (local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    this_00._M_pi =
         local_b8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_c8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      this_00._M_pi =
           local_b8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
    }
    goto joined_r0x00141452;
  case 1:
    if (((float)puVar7[0x3a] != 1.0) || (NAN((float)puVar7[0x3a]))) {
      this_01 = (MetalMaterial *)alignedUSMMalloc(0xb0,0x10,DEVICE_READ_ONLY);
      local_138 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
      MetallicPaintMaterial::MetallicPaintMaterial
                ((MetallicPaintMaterial *)this_01,(Vec3fa *)(puVar7 + 0xc),
                 (Vec3fa *)&local_138.field_1,0.0,(float)puVar7[0x41]);
      break;
    }
    pOVar6 = (OBJMaterial *)alignedUSMMalloc(0x180,0x10,DEVICE_READ_ONLY);
    local_88.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_88.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_138 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
    local_98.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_98.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_128.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(puVar7 + 0x20);
    local_128.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar7 + 0x22);
    if (local_128.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_128.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_128.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_128.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_128.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    local_a8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_a8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
    local_58.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_68.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_78.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_78.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    OBJMaterial::OBJMaterial
              (pOVar6,1.0,&local_88,(Vec3fa *)&local_138.field_1,&local_98,(Vec3fa *)(puVar7 + 0xc),
               &local_128,(Vec3fa *)(puVar7 + 0x10),&local_a8,(Vec3fa *)&local_48.field_1,&local_58,
               1.0 / ((float)puVar7[0x34] + 1e-06),&local_68,&local_78);
    *(OBJMaterial **)this = pOVar6;
    (*(pOVar6->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pOVar6);
    if (local_78.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_68.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_58.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_a8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_128.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    this_00._M_pi =
         local_88.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_98.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      this_00._M_pi =
           local_88.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
    }
joined_r0x00141452:
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    goto LAB_001410b3;
  case 2:
    this_01 = (MetalMaterial *)alignedUSMMalloc(0xb0,0x10,DEVICE_READ_ONLY);
    local_138._8_8_ = 0x3f8000003f800000;
    local_138._0_8_ = 0x3f8000003f800000;
    ThinDielectricMaterial::ThinDielectricMaterial
              ((ThinDielectricMaterial *)this_01,(Vec3fa *)&local_138.field_1,(float)puVar7[0x41],
               0.1);
    break;
  case 3:
    if (((float)puVar7[0x34] != 0.0) || (NAN((float)puVar7[0x34]))) {
      this_01 = (MetalMaterial *)alignedUSMMalloc(0xc0,0x10,DEVICE_READ_ONLY);
      local_138.m128[3] = 0.0;
      local_138.field_1 =
           (anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1)
           *(undefined1 (*) [12])(puVar7 + 0x41);
      local_48.m128[2] = (float)(int)((ulong)*(undefined8 *)(puVar7 + 0x45) >> 0x20);
      local_48._0_8_ = *(undefined8 *)(puVar7 + 0x44);
      local_48.m128[3] = 0.0;
      MetalMaterial::MetalMaterial
                (this_01,(Vec3fa *)(puVar7 + 0xc),(Vec3fa *)&local_138.field_1,
                 (Vec3fa *)&local_48.field_1,(float)puVar7[0x34]);
    }
    else {
      auVar3._4_4_ = -(uint)((float)puVar7[0x42] == 1.0);
      auVar3._0_4_ = -(uint)((float)puVar7[0x41] == 1.0);
      auVar3._8_4_ = -(uint)((float)puVar7[0x43] == 1.0);
      auVar3._12_4_ = 0;
      uVar4 = movmskps((&switchD_00140dc5::switchdataD_0024e358)[uVar1] + 0x24e358,auVar3);
      if (((~(byte)uVar4 & 7) == 0) &&
         (auVar2._4_4_ = -(uint)((float)*(undefined8 *)(puVar7 + 0x45) == 0.0),
         auVar2._0_4_ = -(uint)((float)puVar7[0x44] == 0.0),
         auVar2._8_4_ = -(uint)((float)((ulong)*(undefined8 *)(puVar7 + 0x45) >> 0x20) == 0.0),
         auVar2._12_4_ = 0xffffffff,
         uVar4 = movmskps(CONCAT31((int3)((uint)uVar4 >> 8),~(byte)uVar4),auVar2),
         (~(byte)uVar4 & 7) == 0)) {
        this_01 = (MetalMaterial *)alignedUSMMalloc(0x90,0x10,DEVICE_READ_ONLY);
        MirrorMaterial::MirrorMaterial((MirrorMaterial *)this_01,(Vec3fa *)(puVar7 + 0xc));
      }
      else {
        this_01 = (MetalMaterial *)alignedUSMMalloc(0xc0,0x10,DEVICE_READ_ONLY);
        local_138.m128[3] = 0.0;
        local_138.field_1 =
             (anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1)
             *(undefined1 (*) [12])(puVar7 + 0x41);
        local_48.m128[2] = (float)(int)((ulong)*(undefined8 *)(puVar7 + 0x45) >> 0x20);
        local_48._0_8_ = *(undefined8 *)(puVar7 + 0x44);
        local_48.m128[3] = 0.0;
        MetalMaterial::MetalMaterial
                  (this_01,(Vec3fa *)(puVar7 + 0xc),(Vec3fa *)&local_138.field_1,
                   (Vec3fa *)&local_48.field_1);
      }
    }
    break;
  case 4:
    this_01 = (MetalMaterial *)alignedUSMMalloc(0xb0,0x10,DEVICE_READ_ONLY);
    MetallicPaintMaterial::MetallicPaintMaterial
              ((MetallicPaintMaterial *)this_01,(Vec3fa *)(puVar7 + 0xc),(Vec3fa *)(puVar7 + 0x10),
               0.0,(float)puVar7[0x3a]);
  }
  *(MetalMaterial **)this = this_01;
  pp_Var5 = (this_01->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount;
LAB_001410b0:
  (*pp_Var5[2])(this_01);
LAB_001410b3:
  return (int)this;
}

Assistant:

Ref<SceneGraph::MaterialNode> select() const 
    {
      std::shared_ptr<Texture> nulltex;
      if (type == NONE) {
        return new OBJMaterial(d,map_d,Ka,map_Ka,Kd,map_Kd,Ks,map_Ks,Kt,map_Kt,Ns,map_Ns,map_Displ);
      } else if (type == MATTE) {
        if (coat_eta != 1.0f) return new MetallicPaintMaterial (Kd,zero,0.0f,eta.x);
        else                  return new OBJMaterial(1.0f,nulltex,zero,nulltex,Kd,map_Kd,Ks,nulltex,zero,nulltex,1.0f/(1E-6f+roughness),nulltex,nulltex);
      } else if (type == GLASS) {
        return new ThinDielectricMaterial(Vec3fa(1.0f),eta.x,0.1f);
      } else if (type == METAL) {
        if (roughness == 0.0f) {
          if (eta == Vec3fa(1.0f) && k == Vec3fa(0.0f)) return new MirrorMaterial(Kd);
          else                                          return new MetalMaterial(Kd,eta,k);
        }
        else return new MetalMaterial(Kd,eta,k,roughness);
      } else if (type == METALLIC_PAINT) {
        return new MetallicPaintMaterial (Kd,Ks,0.0f,coat_eta);
      }
      return new MatteMaterial(Vec3fa(0.5f));
    }